

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

shared_ptr<httplib::Response> __thiscall
httplib::Client::Get(Client *this,char *path,Headers *headers,Progress *progress)

{
  _Alloc_hider _Var1;
  element_type *peVar2;
  size_type sVar3;
  char cVar4;
  socket_t sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  function<bool_(unsigned_long,_unsigned_long)> *in_R8;
  shared_ptr<httplib::Response> sVar6;
  shared_ptr<httplib::Response> res;
  Request req;
  undefined1 local_1b9;
  _Alloc_hider local_1b8;
  _Alloc_hider local_1b0;
  element_type *local_1a8;
  Request local_1a0;
  
  local_1a0.version._M_dataplus._M_p = (pointer)&local_1a0.version.field_2;
  local_1a0.version._M_string_length = 0;
  local_1a0.version.field_2._M_local_buf[0] = '\0';
  local_1a0.method._M_dataplus._M_p = (pointer)&local_1a0.method.field_2;
  local_1a0.method._M_string_length = 0;
  local_1a0.method.field_2._M_local_buf[0] = '\0';
  local_1a0.target._M_dataplus._M_p = (pointer)&local_1a0.target.field_2;
  local_1a0.target._M_string_length = 0;
  local_1a0.target.field_2._M_local_buf[0] = '\0';
  local_1a0.path._M_dataplus._M_p = (pointer)&local_1a0.path.field_2;
  local_1a0.path._M_string_length = 0;
  local_1a0.path.field_2._M_local_buf[0] = '\0';
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.body._M_dataplus._M_p = (pointer)&local_1a0.body.field_2;
  local_1a0.body._M_string_length = 0;
  local_1a0.body.field_2._M_local_buf[0] = '\0';
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0.progress._M_invoker = (_Invoker_type)0x0;
  local_1a0.progress.super__Function_base._M_functor._8_8_ = 0;
  local_1a0.progress.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1a0.matches._M_begin._M_current = (char *)0x0;
  local_1a0.progress.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1a0.matches.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.matches.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.matches.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8 = (element_type *)this;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_replace((ulong)&local_1a0.method,0,(char *)0x0,0x15c498);
  sVar3 = local_1a0.path._M_string_length;
  strlen((char *)headers);
  std::__cxx11::string::_M_replace((ulong)&local_1a0.path,0,(char *)sVar3,(ulong)headers);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_1a0.headers._M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)progress);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=(&local_1a0.progress,in_R8);
  local_1b8._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<httplib::Response,std::allocator<httplib::Response>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b0,(Response **)&local_1b8,
             (allocator<httplib::Response> *)&local_1b9);
  _Var1._M_p = local_1b8._M_p;
  if ((char *)local_1a0.path._M_string_length != (char *)0x0) {
    sVar5 = detail::
            create_socket<httplib::Client::create_client_socket()const::_lambda(int,addrinfo&)_1_>
                      (*(char **)(path + 8),*(int *)(path + 0x28),(anon_class_8_1_8991fb9c)path,0);
    if (sVar5 != -1) {
      cVar4 = (**(code **)(*(long *)path + 0x18))(path,sVar5,&local_1a0,_Var1._M_p);
      if (cVar4 != '\0') {
        (local_1a8->version)._M_dataplus._M_p = local_1b8._M_p;
        (((string *)&(local_1a8->version)._M_string_length)->_M_dataplus)._M_p = local_1b0._M_p;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_1b0._M_p + 8) = *(int *)(local_1b0._M_p + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_1b0._M_p + 8) = *(int *)(local_1b0._M_p + 8) + 1;
          }
        }
        goto LAB_00141ddc;
      }
    }
  }
  (local_1a8->version)._M_dataplus._M_p = (pointer)0x0;
  (((string *)&(local_1a8->version)._M_string_length)->_M_dataplus)._M_p = (pointer)0x0;
LAB_00141ddc:
  peVar2 = local_1a8;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p);
  }
  Request::~Request(&local_1a0);
  sVar6.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (shared_ptr<httplib::Response>)
         sVar6.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Response> Client::Get(const char* path, const Headers& headers, Progress progress)
{
    Request req;
    req.method = "GET";
    req.path = path;
    req.headers = headers;
    req.progress = progress;

    auto res = std::make_shared<Response>();

    return send(req, *res) ? res : nullptr;
}